

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::GetUIntLength(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  byte local_3e;
  byte local_3d;
  int local_3c;
  uchar m;
  uchar b;
  long lStack_38;
  int status;
  longlong available;
  longlong total;
  long *len_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (pos < 0)) {
    pReader_local = (IMkvReader *)0xfffffffffffffffe;
  }
  else {
    total = (longlong)len;
    len_local = (long *)pos;
    pos_local = (longlong)pReader;
    local_3c = (*pReader->_vptr_IMkvReader[1])(pReader,&available,&stack0xffffffffffffffc8);
    if ((local_3c < 0) || ((-1 < available && (available < lStack_38)))) {
      pReader_local = (IMkvReader *)0xfffffffffffffffe;
    }
    else {
      *(undefined8 *)total = 1;
      if ((long)len_local < lStack_38) {
        iVar1 = (*(code *)**(undefined8 **)pos_local)(pos_local,len_local,1,&local_3d);
        if (iVar1 == 0) {
          if (local_3d == 0) {
            pReader_local = (IMkvReader *)0xfffffffffffffffe;
          }
          else {
            for (local_3e = 0x80; (local_3d & local_3e) == 0;
                local_3e = (byte)((int)(uint)local_3e >> 1)) {
              *(long *)total = *(long *)total + 1;
            }
            pReader_local = (IMkvReader *)0x0;
          }
        }
        else {
          pReader_local = (IMkvReader *)(long)iVar1;
        }
      }
      else {
        pReader_local = (IMkvReader *)len_local;
      }
    }
  }
  return (longlong)pReader_local;
}

Assistant:

long long GetUIntLength(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  int status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return E_FILE_FORMAT_INVALID;

  len = 1;

  if (pos >= available)
    return pos;  // too few bytes available

  unsigned char b;

  status = pReader->Read(pos, 1, &b);

  if (status != 0)
    return status;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  return 0;  // success
}